

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_wait_release.h
# Opt level: O2

__pid_t __thiscall kmp_flag_32::wait(kmp_flag_32 *this,void *__stat_loc)

{
  uint uVar1;
  kmp_int32 gtid;
  int iVar2;
  __pid_t _Var3;
  uint *puVar4;
  void *in_RCX;
  int in_EDX;
  long lVar5;
  int iVar6;
  kmp_uint32 kVar7;
  uint local_48;
  int tasks_completed;
  uint *local_40;
  void *local_38;
  
  local_40 = (this->super_kmp_basic_flag<unsigned_int>).super_kmp_flag<unsigned_int>.loc;
  tasks_completed = 0;
  puVar4 = (this->super_kmp_basic_flag<unsigned_int>).super_kmp_flag<unsigned_int>.loc;
  uVar1 = *(uint *)&(this->super_kmp_basic_flag<unsigned_int>).super_kmp_flag<unsigned_int>.
                    field_0xc;
  if (*puVar4 == uVar1) {
    if (__kmp_itt_prepare_delay < 1 && __kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0) {
LAB_00136de8:
      _Var3 = (*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(local_40);
      return _Var3;
    }
  }
  else {
    gtid = *(kmp_int32 *)((long)__stat_loc + 0x24);
    if (__kmp_dflt_blocktime != 0x7fffffff) {
      if (((__kmp_zero_bt == 0) || (*(int *)((long)__stat_loc + 0x88) != 0)) &&
         (*(int *)((long)__stat_loc + 0x84) != 0)) {
        iVar6 = *(int *)((long)__stat_loc + 0x84) + 1;
      }
      else {
        iVar6 = 0;
      }
      local_48 = iVar6 + __kmp_global._0_4_;
    }
    iVar6 = 0;
    kVar7 = __kmp_yield_init;
    local_38 = in_RCX;
    while (*puVar4 != uVar1) {
      if ((__kmp_tasking_mode == tskm_immediate_exec) ||
         (lVar5 = *(long *)((long)__stat_loc + 0x170), lVar5 == 0)) {
        lVar5 = 0;
      }
      else if (*(int *)(lVar5 + 0xc0) == 0) {
        *(undefined8 *)((long)__stat_loc + 0x170) = 0;
      }
      else if (*(int *)(lVar5 + 0x50) == 1) {
        __kmp_execute_tasks_32
                  ((kmp_info_t *)__stat_loc,gtid,this,in_EDX,&tasks_completed,local_38,0);
      }
      if (__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) {
        if (iVar6 < __kmp_itt_prepare_delay) {
          iVar6 = iVar6 + 1;
          if (__kmp_itt_prepare_delay <= iVar6) {
            (*(code *)__kmp_itt_fsync_prepare_ptr__3_0)(local_40);
          }
        }
      }
      if (__kmp_global.g.g_done != 0) {
LAB_00136dad:
        if (__kmp_global.g.g_abort != 0) {
          __kmp_abort_thread();
        }
        break;
      }
      __kmp_yield((uint)(__kmp_avail_proc < __kmp_nth));
      kVar7 = kVar7 - 2;
      if (kVar7 == 0) {
        __kmp_yield(1);
        kVar7 = __kmp_yield_next;
      }
      iVar2 = *(int *)((long)__stat_loc + 0x60);
      if ((*(char *)((long)__stat_loc + 0x198) == '\0') == (iVar2 != 0)) {
        if (iVar2 == 0) {
          LOCK();
          __kmp_thread_pool_active_nth = __kmp_thread_pool_active_nth + -1;
          UNLOCK();
        }
        else {
          LOCK();
          __kmp_thread_pool_active_nth = __kmp_thread_pool_active_nth + 1;
          UNLOCK();
        }
        *(bool *)((long)__stat_loc + 0x198) = iVar2 != 0;
      }
      if (((__kmp_dflt_blocktime != 0x7fffffff) && ((lVar5 == 0 || (*(int *)(lVar5 + 0x50) == 0))))
         && (local_48 <= (uint)__kmp_global._0_4_)) {
        __kmp_suspend_32(gtid,this);
        if (__kmp_global.g.g_done != 0) goto LAB_00136dad;
      }
      uVar1 = *(uint *)&(this->super_kmp_basic_flag<unsigned_int>).super_kmp_flag<unsigned_int>.
                        field_0xc;
      puVar4 = (this->super_kmp_basic_flag<unsigned_int>).super_kmp_flag<unsigned_int>.loc;
    }
    if (__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0 && __kmp_itt_prepare_delay <= iVar6)
    goto LAB_00136de8;
  }
  return (__pid_t)__kmp_itt_fsync_acquired_ptr__3_0;
}

Assistant:

void wait(kmp_info_t *this_thr, int final_spin
              USE_ITT_BUILD_ARG(void * itt_sync_obj)) {
        __kmp_wait_template(this_thr, this, final_spin
                            USE_ITT_BUILD_ARG(itt_sync_obj));
    }